

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O0

void __thiscall Simplex::printU(Simplex *this)

{
  FILE *pFVar1;
  uint uVar2;
  vec<IndexVal> *pvVar3;
  IndexVal *pIVar4;
  uint *puVar5;
  int __c;
  int __c_00;
  char *pcVar6;
  long in_RDI;
  int i_2;
  uint j_1;
  int i_1;
  uint j;
  int i;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  fprintf(_stderr,"U:\n");
  for (local_c = 0; (int)local_c < *(int *)(in_RDI + 4); local_c = local_c + 1) {
    pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xe0),local_c);
    uVar2 = vec<IndexVal>::size(pvVar3);
    if (uVar2 != 0) {
      fprintf(_stderr,"row %d: ",(ulong)local_c);
    }
    local_10 = 0;
    while( true ) {
      pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xe0),local_c);
      uVar2 = vec<IndexVal>::size(pvVar3);
      pFVar1 = _stderr;
      if (uVar2 <= local_10) break;
      pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xe0),local_c);
      pcVar6 = (char *)(ulong)local_10;
      pIVar4 = vec<IndexVal>::operator[](pvVar3,local_10);
      puVar5 = (uint *)IndexVal::index(pIVar4,pcVar6,__c);
      uVar2 = *puVar5;
      pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xe0),local_c);
      pIVar4 = vec<IndexVal>::operator[](pvVar3,local_10);
      IndexVal::val(pIVar4);
      fprintf(pFVar1,"%d:%.3Lf ",(ulong)uVar2);
      local_10 = local_10 + 1;
    }
    pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xe0),local_c);
    uVar2 = vec<IndexVal>::size(pvVar3);
    if (uVar2 != 0) {
      fprintf(_stderr,"\n");
    }
  }
  for (local_14 = 0; (int)local_14 < *(int *)(in_RDI + 4); local_14 = local_14 + 1) {
    pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xd0),local_14);
    uVar2 = vec<IndexVal>::size(pvVar3);
    if (uVar2 != 0) {
      fprintf(_stderr,"col %d: ",(ulong)local_14);
    }
    local_18 = 0;
    while( true ) {
      pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xd0),local_14);
      uVar2 = vec<IndexVal>::size(pvVar3);
      pFVar1 = _stderr;
      if (uVar2 <= local_18) break;
      pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xd0),local_14);
      pcVar6 = (char *)(ulong)local_18;
      pIVar4 = vec<IndexVal>::operator[](pvVar3,local_18);
      puVar5 = (uint *)IndexVal::index(pIVar4,pcVar6,__c_00);
      uVar2 = *puVar5;
      pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xd0),local_14);
      pIVar4 = vec<IndexVal>::operator[](pvVar3,local_18);
      IndexVal::val(pIVar4);
      fprintf(pFVar1,"%d:%.3Lf ",(ulong)uVar2);
      local_18 = local_18 + 1;
    }
    pvVar3 = vec<vec<IndexVal>_>::operator[]((vec<vec<IndexVal>_> *)(in_RDI + 0xd0),local_14);
    uVar2 = vec<IndexVal>::size(pvVar3);
    if (uVar2 != 0) {
      fprintf(_stderr,"\n");
    }
  }
  fprintf(_stderr,"diag: ");
  for (local_1c = 0; (int)local_1c < *(int *)(in_RDI + 4); local_1c = local_1c + 1) {
    fprintf(_stderr,"%d:%.3Lf ",(ulong)local_1c);
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void Simplex::printU() {
	fprintf(stderr, "U:\n");
	for (int i = 0; i < m; i++) {
		if (U_rows[i].size() != 0) {
			fprintf(stderr, "row %d: ", i);
		}
		for (unsigned int j = 0; j < U_rows[i].size(); j++) {
			fprintf(stderr, "%d:%.3Lf ", U_rows[i][j].index(), U_rows[i][j].val());
		}
		if (U_rows[i].size() != 0) {
			fprintf(stderr, "\n");
		}
	}
	for (int i = 0; i < m; i++) {
		if (U_cols[i].size() != 0) {
			fprintf(stderr, "col %d: ", i);
		}
		for (unsigned int j = 0; j < U_cols[i].size(); j++) {
			fprintf(stderr, "%d:%.3Lf ", U_cols[i][j].index(), U_cols[i][j].val());
		}
		if (U_cols[i].size() != 0) {
			fprintf(stderr, "\n");
		}
	}
	fprintf(stderr, "diag: ");
	for (int i = 0; i < m; i++) {
		fprintf(stderr, "%d:%.3Lf ", i, U_diag[i]);
	}
	fprintf(stderr, "\n");
}